

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O0

NetAddress * __thiscall miniros::network::NetAddress::operator=(NetAddress *this,NetAddress *other)

{
  void *pvVar1;
  size_t __n;
  NetAddress *in_RSI;
  NetAddress *in_RDI;
  sockaddr_in *addr;
  NetAddress *in_stack_ffffffffffffffd0;
  void *__src;
  
  if (in_RDI != in_RSI) {
    reset(in_stack_ffffffffffffffd0);
    if ((in_RSI->rawAddress == (void *)0x0) ||
       ((in_RSI->type != AddressIPv4 && (in_RSI->type != AddressIPv6)))) {
      in_RDI->type = AddressInvalid;
    }
    else {
      pvVar1 = malloc(0x10);
      in_RDI->rawAddress = pvVar1;
      pvVar1 = in_RDI->rawAddress;
      __src = in_RSI->rawAddress;
      __n = getAddressSize(in_RSI->type);
      memcpy(pvVar1,__src,__n);
      in_RDI->type = in_RSI->type;
    }
    in_RDI->port = in_RSI->port;
    std::__cxx11::string::operator=((string *)&in_RDI->address,(string *)&in_RSI->address);
  }
  return in_RDI;
}

Assistant:

NetAddress& NetAddress::operator=(const NetAddress& other)
{
  if (this == &other)
    return *this;
  reset();

  if (other.rawAddress && (other.type == Type::AddressIPv4 || other.type == Type::AddressIPv6)) {
    sockaddr_in* addr = static_cast<sockaddr_in*>(malloc(sizeof(sockaddr_in)));
    rawAddress = addr;
    memcpy(rawAddress, other.rawAddress, getAddressSize(other.type));
    type = other.type;
  } else {
    type = Type::AddressInvalid;
  }
  port = other.port;
  address = other.address;
  return *this;
}